

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_compression.c
# Opt level: O2

int ptls_init_compressed_certificate
              (ptls_emit_compressed_certificate_t *self,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  int iVar1;
  int iVar2;
  
  (self->super).cb = emit_compressed_certificate;
  self->algo = 2;
  *(undefined8 *)&self->field_0xa = 0;
  *(undefined8 *)((long)&(self->with_ocsp_status).uncompressed_length + 2) = 0;
  *(undefined8 *)((long)&(self->with_ocsp_status).bytes.base + 2) = 0;
  *(undefined8 *)((long)&(self->with_ocsp_status).bytes.len + 2) = 0;
  *(undefined8 *)((long)&(self->without_ocsp_status).uncompressed_length + 2) = 0;
  *(undefined8 *)((long)&(self->without_ocsp_status).bytes.base + 2) = 0;
  (self->without_ocsp_status).bytes.len = 0;
  iVar2 = 0;
  iVar1 = build_compressed(&self->without_ocsp_status,certificates,num_certificates,
                           (ptls_iovec_t)ZEXT816(0));
  if ((iVar1 != 0) ||
     ((ocsp_status.len != 0 &&
      (iVar1 = build_compressed(&self->with_ocsp_status,certificates,num_certificates,ocsp_status),
      iVar1 != 0)))) {
    ptls_dispose_compressed_certificate(self);
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int ptls_init_compressed_certificate(ptls_emit_compressed_certificate_t *self, ptls_iovec_t *certificates, size_t num_certificates,
                                     ptls_iovec_t ocsp_status)
{
    int ret;

    *self = (ptls_emit_compressed_certificate_t){{emit_compressed_certificate}, PTLS_CERTIFICATE_COMPRESSION_ALGORITHM_BROTLI};

    /* build entries */
    if ((ret = build_compressed(&self->without_ocsp_status, certificates, num_certificates, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if (ocsp_status.len != 0) {
        if ((ret = build_compressed(&self->with_ocsp_status, certificates, num_certificates, ocsp_status)) != 0)
            goto Exit;
    }

    ret = 0;

Exit:
    if (ret != 0)
        ptls_dispose_compressed_certificate(self);
    return ret;
}